

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_short,_unsigned_short>::Run
          (DataTransform<unsigned_short,_unsigned_short> *this,istream *input_stream)

{
  ushort uVar1;
  NumericType NVar2;
  WarningType WVar3;
  char *__nptr;
  int *piVar4;
  undefined8 uVar5;
  ostream *poVar6;
  size_t sVar7;
  ushort data_to_write;
  int iVar8;
  int iVar9;
  bool bVar10;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar11;
  unsigned_short input_data;
  string word;
  char buffer [128];
  ushort local_260;
  ushort local_25e;
  int local_25c;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  iVar9 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar8 = 2;
        bVar10 = false;
      }
      else {
        piVar4 = __errno_location();
        iVar8 = *piVar4;
        *piVar4 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar5 = std::__throw_invalid_argument("stold");
LAB_0012e825:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar5);
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar8;
        }
        else if (*piVar4 == 0x22) {
          uVar5 = std::__throw_out_of_range("stold");
          goto LAB_0012e825;
        }
        local_25e = in_FPUControlWord | 0xc00;
        local_25c = (int)ROUND(in_ST0);
        local_260 = (ushort)local_25c;
        iVar8 = 0;
        bVar10 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar10) {
LAB_0012e59d:
        data_to_write = this->minimum_value_;
        uVar1 = this->maximum_value_;
        if ((data_to_write < uVar1) &&
           (((NVar2 = this->input_numeric_type_, NVar2 == kFloatingPoint ||
             (NVar2 == kUnsignedInteger)) || (NVar2 == kSignedInteger)))) {
          bVar10 = true;
          if ((data_to_write <= local_260) &&
             (bVar10 = uVar1 < local_260, data_to_write = uVar1, !bVar10)) {
            data_to_write = local_260;
          }
        }
        else {
          bVar10 = false;
          data_to_write = local_260;
        }
        if ((!bVar10) && (this->rounding_ != false)) {
          if (local_260 == 0) {
            dVar11 = (double)local_260 + -0.5;
          }
          else {
            dVar11 = (double)local_260 + 0.5;
          }
          data_to_write = (ushort)(int)dVar11;
        }
        if ((bool)(bVar10 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar8 = 1;
          if (WVar3 == kExit) goto LAB_0012e775;
        }
        if (this->is_ascii_output_ == true) {
          bVar10 = sptk::SnPrintf<unsigned_short>(data_to_write,local_238,0x80,local_b8);
          iVar8 = 1;
          if (bVar10) {
            sVar7 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar7)
            ;
            if ((iVar9 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_0012e772:
            iVar8 = 0;
          }
        }
        else {
          bVar10 = sptk::WriteStream<unsigned_short>(data_to_write,(ostream *)&std::cout);
          iVar8 = 1;
          if (bVar10) goto LAB_0012e772;
        }
      }
    }
    else {
      bVar10 = sptk::ReadStream<unsigned_short>(&local_260,input_stream);
      iVar8 = 2;
      if (bVar10) goto LAB_0012e59d;
    }
LAB_0012e775:
    if (iVar8 != 0) {
      if (iVar8 == 2) {
        bVar10 = true;
        if ((this->is_ascii_output_ == true) && (iVar9 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar10 = false;
      }
      return bVar10;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }